

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O2

bool CheckProperty(TestResult *tr,char *key,char *value)

{
  bool bVar1;
  UnitTest *this;
  byte unaff_BPL;
  int *in_R9;
  type **in_stack_fffffffffffffc58;
  AssertionResult iutest_ar;
  iuCodeMessage local_378;
  ReturnTypedFixed<bool> local_348;
  iuStreamMessage local_1b8;
  
  if (tr != (TestResult *)0x0) {
    local_348.fixed.super_Message.m_stream.super_iu_stringstream._0_4_ = 1;
    local_1b8.m_stream.super_iu_stringstream._0_4_ =
         SUB84((ulong)((long)(tr->m_test_propertys).
                             super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(tr->m_test_propertys).
                            super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 6,0);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x127a22,"tr->test_property_count()",(char *)&local_348,
               (int *)&local_1b8,in_R9);
    bVar1 = iutest_ar.m_result;
    if (iutest_ar.m_result == false) {
      memset(&local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_348,&local_1b8);
      local_348.ret.value = false;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x29,iutest_ar.m_message._M_dataplus._M_p);
      local_378._44_4_ = 2;
      unaff_BPL = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_348);
      std::__cxx11::string::~string((string *)&local_378);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_348);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    if (bVar1 == false) goto LAB_00116a6d;
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)0x126542,"tr->GetTestProperty(0).key()",key,
               (((tr->m_test_propertys).
                 super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_key)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc58);
    if (iutest_ar.m_result == false) {
      memset(&local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_348,&local_1b8);
      local_348.ret.value = false;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x2a,iutest_ar.m_message._M_dataplus._M_p);
      local_378._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_348);
      std::__cxx11::string::~string((string *)&local_378);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_348);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"value","tr->GetTestProperty(0).value()",value,
               (((tr->m_test_propertys).
                 super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_value)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc58);
    if (iutest_ar.m_result == false) {
      memset(&local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_348,&local_1b8);
      local_348.ret.value = false;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
                 ,0x2b,iutest_ar.m_message._M_dataplus._M_p);
      local_378._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_348);
      std::__cxx11::string::~string((string *)&local_378);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_348);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
  }
  this = iutest::UnitTest::instance();
  unaff_BPL = iutest::UnitTest::Passed(this);
LAB_00116a6d:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CheckProperty(const ::iutest::TestResult* tr, const char* key, const char* value)
{
#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    try {
#endif

#if IUTEST_HAS_ASSERTION_RETURN
    if( tr != NULL )
    {
        IUTEST_ASSERT_EQ(1, tr->test_property_count()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(key, tr->GetTestProperty(0).key()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(value, tr->GetTestProperty(0).value()) << ::iutest::AssertionReturn(false);
    }
#else
    CheckProperty_(tr, key, value);
#endif

#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    } catch(...) {}
#endif
    return ::iutest::UnitTest::GetInstance()->Passed();
}